

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

array_n<char,_3,_std::allocator<char>_> * __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::operator=
          (array_n<char,_3,_std::allocator<char>_> *this,
          array_n<char,_3,_std::allocator<char>_> *obj)

{
  pointer pcVar1;
  pointer pcVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong __n;
  array_n<char,_3,_std::allocator<char>_> copy;
  array_n<char,_3,_std::allocator<char>_> local_40;
  
  local_40._dims[2] = obj->_dims[2];
  local_40._dims._0_8_ = *(undefined8 *)obj->_dims;
  uVar4 = 1;
  lVar6 = 2;
  do {
    uVar4 = uVar4 * obj->_dims[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  __n = (ulong)uVar4;
  if (uVar4 == 0) {
    local_40._array = (pointer)0x0;
  }
  else {
    local_40._array = (char *)operator_new(__n);
    uVar5 = 0;
    do {
      local_40._array[uVar5] = '\0';
      uVar5 = uVar5 + 1;
    } while (__n != uVar5);
    local_40.last = local_40._array + uVar5;
    local_40.first = local_40._array;
  }
  memcpy(local_40._array,obj->_array,__n);
  lVar6 = 2;
  do {
    uVar4 = this->_dims[lVar6 + -2];
    this->_dims[lVar6 + -2] = local_40._dims[lVar6 + -2];
    local_40._dims[lVar6 + -2] = uVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  pcVar1 = this->first;
  this->first = local_40.first;
  pcVar2 = this->last;
  this->last = local_40.last;
  pcVar3 = this->_array;
  this->_array = local_40._array;
  local_40._array = pcVar3;
  local_40.first = pcVar1;
  local_40.last = pcVar2;
  ~array_n(&local_40);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }